

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_quad_rule.cc
# Opt level: O0

QuadRule * lf::quad::make_TriaQR_MidpointRule(void)

{
  Scalar *pSVar1;
  Scalar *pSVar2;
  QuadRule *in_RDI;
  Matrix<double,__1,_1,_0,__1,_1> local_80;
  Matrix<double,__1,__1,_0,__1,__1> local_70;
  RefEl local_55;
  int local_44;
  undefined1 local_40 [8];
  VectorXd weights;
  undefined1 local_28 [8];
  MatrixXd points;
  
  weights.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ = 2;
  weights.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._0_4_ = 1;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_28,
             (int *)((long)&weights.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows + 4),
             (int *)&weights.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows);
  local_44 = 1;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_40,&local_44);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,0);
  *pSVar1 = 0.3333333333333333;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,0);
  *pSVar1 = 0.3333333333333333;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,0);
  *pSVar2 = 0.5;
  local_55 = lf::base::RefEl::kTria();
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            (&local_70,(Matrix<double,__1,__1,_0,__1,__1> *)local_28);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            (&local_80,(Matrix<double,__1,_1,_0,__1,_1> *)local_40);
  QuadRule::QuadRule(in_RDI,local_55,&local_70,&local_80,1);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_80);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_70);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_40);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_28);
  return in_RDI;
}

Assistant:

QuadRule make_TriaQR_MidpointRule() {
  Eigen::MatrixXd points(2, 1);
  Eigen::VectorXd weights(1);

  points(0, 0) = 1.0 / 3.0;
  points(1, 0) = 1.0 / 3.0;

  weights(0) = 0.5;

  return QuadRule(base::RefEl::kTria(), std::move(points), std::move(weights),
                  1);
}